

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

Type * LLVMBC::Type::getTy(LLVMContext *context,TypeID id)

{
  pointer *pppTVar1;
  TypeID TVar2;
  pointer ppTVar3;
  Type *pTVar4;
  iterator __position;
  Type *in_RAX;
  pointer ppTVar5;
  bool bVar6;
  Type *type;
  TypeID local_14;
  Type *local_10;
  
  ppTVar5 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppTVar5 == ppTVar3;
  local_10 = in_RAX;
  if (!bVar6) {
    pTVar4 = *ppTVar5;
    TVar2 = pTVar4->type_id;
    local_10 = pTVar4;
    while (TVar2 != id) {
      ppTVar5 = ppTVar5 + 1;
      bVar6 = ppTVar5 == ppTVar3;
      local_10 = pTVar4;
      if (bVar6) break;
      local_10 = *ppTVar5;
      TVar2 = local_10->type_id;
    }
  }
  if (bVar6) {
    local_14 = id;
    local_10 = LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
                         (context,context,&local_14);
    __position._M_current =
         (context->type_cache).
         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      _M_realloc_insert<LLVMBC::Type*const&>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &context->type_cache,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppTVar1 = &(context->type_cache).
                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return local_10;
}

Assistant:

Type *Type::getTy(LLVMContext &context, TypeID id)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == id)
			return type;

	auto *type = context.construct<Type>(context, id);
	cache.push_back(type);
	return type;
}